

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.c
# Opt level: O0

uint solver_clause_create(solver_t *s,vec_uint_t *lits,uint f_learnt)

{
  uint uVar1;
  uint uVar2;
  clause_conflict *clause_00;
  uint *puVar3;
  uint n_words;
  uint cref;
  clause_conflict *clause;
  uint f_learnt_local;
  vec_uint_t *lits_local;
  solver_t *s_local;
  
  uVar1 = vec_uint_size(lits);
  if (uVar1 < 2) {
    __assert_fail("vec_uint_size(lits) > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                  ,0x1e9,"unsigned int solver_clause_create(solver_t *, vec_uint_t *, unsigned int)"
                 );
  }
  if ((f_learnt != 0) && (f_learnt != 1)) {
    __assert_fail("f_learnt == 0 || f_learnt == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/satoko/solver.c"
                  ,0x1ea,"unsigned int solver_clause_create(solver_t *, vec_uint_t *, unsigned int)"
                 );
  }
  uVar1 = vec_uint_size(lits);
  uVar1 = cdb_append(s->all_clauses,f_learnt + 3 + uVar1);
  clause_00 = clause_fetch(s,uVar1);
  *(uint *)clause_00 = *(uint *)clause_00 & 0xfffffffe | f_learnt & 1;
  *(uint *)clause_00 = *(uint *)clause_00 & 0xfffffffd;
  *(uint *)clause_00 = *(uint *)clause_00 & 0xfffffffb;
  *(uint *)clause_00 = *(uint *)clause_00 & 0xfffffff7 | (f_learnt & 1) << 3;
  uVar2 = vec_uint_size(lits);
  clause_00->size = uVar2;
  puVar3 = vec_uint_data(lits);
  uVar2 = vec_uint_size(lits);
  memcpy(clause_00 + 1,puVar3,(ulong)uVar2 << 2);
  if (f_learnt == 0) {
    vec_uint_push_back(s->originals,uVar1);
    uVar2 = vec_uint_size(lits);
    (s->stats).n_original_lits = (ulong)uVar2 + (s->stats).n_original_lits;
  }
  else {
    vec_uint_push_back(s->learnts,uVar1);
    puVar3 = vec_uint_data(lits);
    uVar2 = vec_uint_size(lits);
    uVar2 = clause_clac_lbd(s,puVar3,uVar2);
    *(uint *)clause_00 = *(uint *)clause_00 & 0xf | uVar2 << 4;
    *(undefined4 *)(&clause_00[1].field_0x0 + (ulong)clause_00->size * 4) = 0;
    uVar2 = vec_uint_size(lits);
    (s->stats).n_learnt_lits = (ulong)uVar2 + (s->stats).n_learnt_lits;
    clause_act_bump(s,clause_00);
  }
  return uVar1;
}

Assistant:

unsigned solver_clause_create(solver_t *s, vec_uint_t *lits, unsigned f_learnt)
{
    struct clause *clause;
    unsigned cref;
    unsigned n_words;

    assert(vec_uint_size(lits) > 1);
    assert(f_learnt == 0 || f_learnt == 1);

    n_words = 3 + f_learnt + vec_uint_size(lits);
    cref = cdb_append(s->all_clauses, n_words);
    clause = clause_fetch(s, cref);
    clause->f_learnt = f_learnt;
    clause->f_mark = 0;
    clause->f_reallocd = 0;
    clause->f_deletable = f_learnt;
    clause->size = vec_uint_size(lits);
    memcpy(&(clause->data[0].lit), vec_uint_data(lits), sizeof(unsigned) * vec_uint_size(lits));

    if (f_learnt) {
        vec_uint_push_back(s->learnts, cref);
        clause->lbd = clause_clac_lbd(s, vec_uint_data(lits), vec_uint_size(lits));
        clause->data[clause->size].act = 0;
        s->stats.n_learnt_lits += vec_uint_size(lits);
        clause_act_bump(s, clause);
    } else {
        vec_uint_push_back(s->originals, cref);
        s->stats.n_original_lits += vec_uint_size(lits);
    }
    return cref;
}